

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O0

int main(void)

{
  int iVar1;
  long lVar2;
  char *name;
  undefined1 local_30 [4];
  int value;
  nn_symbol_properties sym;
  int i;
  
  sym._28_4_ = 0;
  lVar2 = nn_symbol(0xffffffff,0);
  if (lVar2 != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_symbol (-1, NULL) == NULL",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/symbol.c"
            ,0x1f);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar1 = nn_errno();
  if (iVar1 != 0x16) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_errno () == EINVAL",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/symbol.c"
            ,0x20);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar1 = nn_symbol_info(0xffffffff,local_30,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
            "nn_symbol_info (-1, &sym, (int) sizeof (sym)) == 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/symbol.c"
            ,0x21);
    fflush(_stderr);
    nn_err_abort();
  }
  lVar2 = nn_symbol(2000,0);
  if (lVar2 != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_symbol (2000, NULL) == NULL",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/symbol.c"
            ,0x23);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar1 = nn_errno();
  if (iVar1 != 0x16) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_errno () == EINVAL",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/symbol.c"
            ,0x24);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar1 = nn_symbol_info(2000,local_30,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
            "nn_symbol_info (2000, &sym, (int) sizeof (sym)) == 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/symbol.c"
            ,0x25);
    fflush(_stderr);
    nn_err_abort();
  }
  lVar2 = nn_symbol(6,(long)&name + 4);
  if (lVar2 == 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_symbol (6, &value) != NULL",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/symbol.c"
            ,0x27);
    fflush(_stderr);
    nn_err_abort();
  }
  if (name._4_4_ == 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","value != 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/symbol.c"
            ,0x28);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar1 = nn_symbol_info(6,local_30,0x20);
  if (iVar1 != 0x20) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
            "nn_symbol_info (6, &sym, (int) sizeof (sym)) == sizeof (sym)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/symbol.c"
            ,0x29);
    fflush(_stderr);
    nn_err_abort();
  }
  sym.unit = 0;
  while( true ) {
    lVar2 = nn_symbol(sym.unit,(long)&name + 4);
    if (lVar2 == 0) break;
    sym.unit = sym.unit + 1;
  }
  iVar1 = nn_errno();
  if (iVar1 != 0x16) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_errno () == EINVAL",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/symbol.c"
            ,0x2e);
    fflush(_stderr);
    nn_err_abort();
  }
  sym.unit = 0;
  while( true ) {
    iVar1 = nn_symbol_info(sym.unit,local_30,0x20);
    if (iVar1 == 0) break;
    sym.unit = sym.unit + 1;
  }
  return 0;
}

Assistant:

int main ()
{
    int i;
    struct nn_symbol_properties sym;
    int value;

    nn_assert (nn_symbol (-1, NULL) == NULL);
    nn_assert (nn_errno () == EINVAL);
    nn_assert (nn_symbol_info (-1, &sym, (int) sizeof (sym)) == 0);

    nn_assert (nn_symbol (2000, NULL) == NULL);
    nn_assert (nn_errno () == EINVAL);
    nn_assert (nn_symbol_info (2000, &sym, (int) sizeof (sym)) == 0);

    nn_assert (nn_symbol (6, &value) != NULL);
    nn_assert (value != 0);
    nn_assert (nn_symbol_info (6, &sym, (int) sizeof (sym)) == sizeof (sym));

    for (i = 0; ; ++i) {
        const char* name = nn_symbol (i, &value);
        if (name == NULL) {
            nn_assert (nn_errno () == EINVAL);
            break;
        }
    }

    for (i = 0; ; ++i) {
        if (nn_symbol_info (i, &sym, sizeof (sym)) == 0)
            break;
    }

    return 0;
}